

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

bool __thiscall jsonnet::internal::SortImports::groupEndsAfter(SortImports *this,Local *local)

{
  Kind *pKVar1;
  Local *ast_;
  AST *pAVar2;
  FodderElement *fodderElem;
  pointer pFVar3;
  bool bVar4;
  bool bVar5;
  
  ast_ = goodLocalOrNull(this,local->body);
  if (ast_ == (Local *)0x0) {
    bVar4 = true;
  }
  else {
    pAVar2 = left_recursive_deep(&ast_->super_AST);
    pFVar3 = (pAVar2->openFodder).
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar5 = false;
    while ((bVar4 = pFVar3 != (pAVar2->openFodder).
                              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              ._M_impl.super__Vector_impl_data._M_finish, bVar4 &&
           (!(bool)(bVar5 | pFVar3->blanks != 0)))) {
      pKVar1 = &pFVar3->kind;
      pFVar3 = pFVar3 + 1;
      bVar5 = *pKVar1 != INTERSTITIAL;
    }
  }
  return bVar4;
}

Assistant:

bool groupEndsAfter(Local *local)
    {
        Local *next = goodLocalOrNull(local->body);
        if (!next) {
            return true;
        }

        bool newlineReached = false;
        for (const auto &fodderElem : open_fodder(next)) {
            if (newlineReached || fodderElem.blanks > 0) {
                return true;
            }
            if (fodderElem.kind != FodderElement::Kind::INTERSTITIAL) {
                newlineReached = true;
            }
        }
        return false;
    }